

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::
emplaceRealloc<slang::ast::RandSeqProductionSymbol::CaseItem>
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem> *this,pointer pos,
          CaseItem *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  size_type sVar4;
  pointer ppEVar5;
  size_t sVar6;
  undefined8 uVar7;
  RandSeqProductionSymbol *pRVar8;
  size_t sVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  pointer pCVar14;
  pointer pCVar15;
  ProdBase PVar16;
  undefined4 uVar17;
  pointer pCVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  
  if (this->len == 0x2aaaaaaaaaaaaaa) {
    detail::throwLengthError();
  }
  uVar20 = this->len + 1;
  uVar3 = this->cap;
  if (uVar20 < uVar3 * 2) {
    uVar20 = uVar3 * 2;
  }
  if (0x2aaaaaaaaaaaaaa - uVar3 < uVar3) {
    uVar20 = 0x2aaaaaaaaaaaaaa;
  }
  lVar21 = (long)pos - (long)this->data_;
  pCVar18 = (pointer)operator_new(uVar20 * 0x30);
  ppEVar5 = (args->expressions)._M_ptr;
  sVar6 = (args->expressions)._M_extent._M_extent_value;
  uVar7 = *(undefined8 *)&args->item;
  pRVar8 = (args->item).target;
  sVar9 = (args->item).args._M_extent._M_extent_value;
  puVar1 = (undefined8 *)((long)pCVar18 + lVar21 + 0x20);
  *puVar1 = (args->item).args._M_ptr;
  puVar1[1] = sVar9;
  puVar1 = (undefined8 *)((long)pCVar18 + lVar21 + 0x10);
  *puVar1 = uVar7;
  puVar1[1] = pRVar8;
  *(undefined8 *)((long)pCVar18 + lVar21) = ppEVar5;
  ((undefined8 *)((long)pCVar18 + lVar21))[1] = sVar6;
  p = this->data_;
  sVar4 = this->len;
  lVar19 = (long)p + (sVar4 * 0x30 - (long)pos);
  pCVar14 = p;
  pCVar15 = pCVar18;
  if (lVar19 == 0) {
    if (sVar4 != 0) {
      lVar19 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(p->expressions)._M_ptr + lVar19);
        uVar7 = *puVar1;
        uVar10 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(p->item).super_ProdBase.kind + lVar19);
        uVar11 = *puVar1;
        uVar12 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(p->item).args._M_ptr + lVar19);
        uVar13 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pCVar18->item).args._M_ptr + lVar19);
        *puVar2 = *puVar1;
        puVar2[1] = uVar13;
        puVar1 = (undefined8 *)((long)&(pCVar18->item).super_ProdBase.kind + lVar19);
        *puVar1 = uVar11;
        puVar1[1] = uVar12;
        puVar1 = (undefined8 *)((long)&(pCVar18->expressions)._M_ptr + lVar19);
        *puVar1 = uVar7;
        puVar1[1] = uVar10;
        lVar19 = lVar19 + 0x30;
      } while (sVar4 * 0x30 != lVar19);
    }
  }
  else {
    for (; pCVar14 != pos; pCVar14 = pCVar14 + 1) {
      ppEVar5 = (pCVar14->expressions)._M_ptr;
      sVar6 = (pCVar14->expressions)._M_extent._M_extent_value;
      PVar16.kind = (pCVar14->item).super_ProdBase.kind;
      uVar17 = *(undefined4 *)&(pCVar14->item).field_0x4;
      pRVar8 = (pCVar14->item).target;
      sVar9 = (pCVar14->item).args._M_extent._M_extent_value;
      (pCVar15->item).args._M_ptr = (pCVar14->item).args._M_ptr;
      (pCVar15->item).args._M_extent._M_extent_value = sVar9;
      (pCVar15->item).super_ProdBase = (ProdBase)PVar16.kind;
      *(undefined4 *)&(pCVar15->item).field_0x4 = uVar17;
      (pCVar15->item).target = pRVar8;
      (pCVar15->expressions)._M_ptr = ppEVar5;
      (pCVar15->expressions)._M_extent._M_extent_value = sVar6;
      pCVar15 = pCVar15 + 1;
    }
    memcpy((void *)((long)pCVar18 + lVar21 + 0x30),pos,((lVar19 - 0x30U) / 0x30) * 0x30 + 0x30);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar20;
  this->data_ = pCVar18;
  return (pointer)((long)pCVar18 + lVar21);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}